

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool
add_item_to_object(cJSON *object,char *string,cJSON *item,internal_hooks *hooks,
                  cJSON_bool constant_key)

{
  uint uVar1;
  cJSON_bool cVar2;
  uint uVar3;
  
  if (item == (cJSON *)0x0 || (string == (char *)0x0 || object == (cJSON *)0x0)) {
    return 0;
  }
  if ((int)hooks == 0) {
    string = (char *)cJSON_strdup((uchar *)string,(internal_hooks *)string);
    if ((uchar *)string == (uchar *)0x0) {
      return 0;
    }
    uVar1 = item->type;
    uVar3 = uVar1 & 0xfffffdff;
  }
  else {
    uVar1 = item->type;
    uVar3 = uVar1 | 0x200;
  }
  if (((uVar1 >> 9 & 1) == 0) && (item->string != (char *)0x0)) {
    (*global_hooks.deallocate)(item->string);
  }
  item->string = string;
  item->type = uVar3;
  cVar2 = add_item_to_array(object,item);
  return cVar2;
}

Assistant:

static cJSON_bool add_item_to_object(cJSON * const object, const char * const string, cJSON * const item, const internal_hooks * const hooks, const cJSON_bool constant_key)
{
    char *new_key = NULL;
    int new_type = cJSON_Invalid;

    if ((object == NULL) || (string == NULL) || (item == NULL))
    {
        return false;
    }

    if (constant_key)
    {
        new_key = (char*)cast_away_const(string);
        new_type = item->type | cJSON_StringIsConst;
    }
    else
    {
        new_key = (char*)cJSON_strdup((const unsigned char*)string, hooks);
        if (new_key == NULL)
        {
            return false;
        }

        new_type = item->type & ~cJSON_StringIsConst;
    }

    if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
    {
        hooks->deallocate(item->string);
    }

    item->string = new_key;
    item->type = new_type;

    return add_item_to_array(object, item);
}